

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  BIT_DStream_t bitD;
  
  uVar3 = *(ushort *)((long)DTable + 2);
  sVar4 = BIT_initDStream(&bitD,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  puVar1 = (undefined1 *)((long)dst + dstSize);
  if ((long)dstSize < 4) {
    if (bitD.bitsConsumed < 0x41) {
      if (bitD.ptr < bitD.limitPtr) {
        if (bitD.ptr == bitD.start) goto LAB_001a7fa5;
        uVar5 = (int)bitD.ptr - (int)bitD.start;
        if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
          uVar5 = bitD.bitsConsumed >> 3;
        }
        bitD.bitsConsumed = bitD.bitsConsumed + uVar5 * -8;
      }
      else {
        uVar5 = bitD.bitsConsumed >> 3;
        bitD.bitsConsumed = bitD.bitsConsumed & 7;
      }
      bitD.ptr = bitD.ptr + -(ulong)uVar5;
      bitD.bitContainer = *(size_t *)bitD.ptr;
    }
  }
  else {
    uVar5 = -(uint)uVar3 & 0x3f;
    while (bitD.bitsConsumed < 0x41) {
      if (bitD.ptr < bitD.limitPtr) {
        if (bitD.ptr == bitD.start) break;
        bVar8 = bitD.start <= (char *)((long)bitD.ptr - (ulong)(bitD.bitsConsumed >> 3));
        uVar6 = (int)bitD.ptr - (int)bitD.start;
        if (bVar8) {
          uVar6 = bitD.bitsConsumed >> 3;
        }
        bitD.bitsConsumed = bitD.bitsConsumed + uVar6 * -8;
      }
      else {
        uVar6 = bitD.bitsConsumed >> 3;
        bitD.bitsConsumed = bitD.bitsConsumed & 7;
        bVar8 = true;
      }
      bitD.ptr = (char *)((long)bitD.ptr - (ulong)uVar6);
      bitD.bitContainer = *(size_t *)bitD.ptr;
      if ((puVar1 + -3 <= dst) || (!bVar8)) break;
      uVar7 = (bitD.bitContainer << ((ulong)bitD.bitsConsumed & 0x3f)) >> uVar5;
      uVar6 = *(byte *)((long)DTable + uVar7 * 2 + 4) + bitD.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar5;
      uVar6 = *(byte *)((long)DTable + uVar7 * 2 + 4) + uVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar5;
      uVar6 = *(byte *)((long)DTable + uVar7 * 2 + 4) + uVar6;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar5;
      bVar2 = *(byte *)((long)DTable + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      dst = (void *)((long)dst + 4);
      bitD.bitsConsumed = bVar2 + uVar6;
    }
  }
LAB_001a7fa5:
  for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
    uVar7 = (bitD.bitContainer << ((ulong)bitD.bitsConsumed & 0x3f)) >> (-(uint)uVar3 & 0x3f);
    bitD.bitsConsumed = *(byte *)((long)DTable + uVar7 * 2 + 4) + bitD.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
  }
  if (bitD.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (bitD.ptr != bitD.start) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}